

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest2::executeTestCase
          (NegativeTest2 *this,_shader_stage *referencing_stage)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  getFragmentShaderBody_abi_cxx11_(&fs_body,this,referencing_stage);
  getGeometryShaderBody_abi_cxx11_(&gs_body,this,referencing_stage);
  getTessellationControlShaderBody_abi_cxx11_(&tc_body,this,referencing_stage);
  getTessellationEvaluationShaderBody_abi_cxx11_(&te_body,this,referencing_stage);
  getVertexShaderBody_abi_cxx11_(&vs_body,this,referencing_stage);
  local_1b0 = (undefined1  [8])((ulong)(uint)local_1b0._4_4_ << 0x20);
  bVar2 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar3),&vs_body,&tc_body,&te_body,
                              &gs_body,&fs_body,(GLchar **)0x0,(uint *)local_1b0,&this->m_vs_id,
                              &this->m_tc_id,&this->m_te_id,&this->m_gs_id,&this->m_fs_id,
                              &this->m_po_id);
  if (bVar2) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "In the following program, one of the stages references a subroutine that is defined in another stage. This is forbidden by the specification.\n\nVertex shader:\n\n"
               ,0x9f);
    _Var1 = vs_body._M_dataplus;
    iVar3 = (int)(ostringstream *)&local_1a8;
    if (vs_body._M_dataplus._M_p == (pointer)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(vs_body._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,_Var1._M_p,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"\n\nTessellation control shader:\n\n",0x20);
    _Var1 = tc_body._M_dataplus;
    if (tc_body._M_dataplus._M_p == (pointer)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(tc_body._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,_Var1._M_p,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"\n\nTessellation evaluation shader:\n\n",0x23);
    _Var1 = te_body._M_dataplus;
    if (te_body._M_dataplus._M_p == (pointer)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(te_body._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,_Var1._M_p,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"\n\nGeometry shader:\n\n",0x14);
    _Var1 = gs_body._M_dataplus;
    if (gs_body._M_dataplus._M_p == (pointer)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(gs_body._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,_Var1._M_p,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"\n\nFragment shader:\n\n",0x14);
    _Var1 = fs_body._M_dataplus;
    if (fs_body._M_dataplus._M_p == (pointer)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(fs_body._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,_Var1._M_p,sVar4);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  deinitGLObjects(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_body._M_dataplus._M_p != &vs_body.field_2) {
    operator_delete(vs_body._M_dataplus._M_p,vs_body.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)te_body._M_dataplus._M_p != &te_body.field_2) {
    operator_delete(te_body._M_dataplus._M_p,te_body.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tc_body._M_dataplus._M_p != &tc_body.field_2) {
    operator_delete(tc_body._M_dataplus._M_p,tc_body.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gs_body._M_dataplus._M_p != &gs_body.field_2) {
    operator_delete(gs_body._M_dataplus._M_p,gs_body.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_body._M_dataplus._M_p != &fs_body.field_2) {
    operator_delete(fs_body._M_dataplus._M_p,fs_body.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NegativeTest2::executeTestCase(const Utils::_shader_stage& referencing_stage)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const std::string fs_body = getFragmentShaderBody(referencing_stage);
	const std::string gs_body = getGeometryShaderBody(referencing_stage);
	const std::string tc_body = getTessellationControlShaderBody(referencing_stage);
	const std::string te_body = getTessellationEvaluationShaderBody(referencing_stage);
	const std::string vs_body = getVertexShaderBody(referencing_stage);

	if (Utils::buildProgram(gl, vs_body, tc_body, te_body, gs_body, fs_body, NULL, /* xfb_varyings */
							0,													   /* n_xfb_varyings */
							&m_vs_id, &m_tc_id, &m_te_id, &m_gs_id, &m_fs_id, &m_po_id))
	{
		/* Test program should not have built correctly ! */
		m_testCtx.getLog() << tcu::TestLog::Message << "In the following program, one of the stages references "
													   "a subroutine that is defined in another stage. This "
													   "is forbidden by the specification.\n"
													   "\n"
													   "Vertex shader:\n\n"
						   << vs_body.c_str() << "\n\nTessellation control shader:\n\n"
						   << tc_body.c_str() << "\n\nTessellation evaluation shader:\n\n"
						   << te_body.c_str() << "\n\nGeometry shader:\n\n"
						   << gs_body.c_str() << "\n\nFragment shader:\n\n"
						   << fs_body.c_str() << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	} /* if (test program was built successfully) */

	/* Release the shaders & the program object that buildProgram() created */
	deinitGLObjects();
}